

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O2

string * __thiscall
s2textformat::ToString_abi_cxx11_
          (string *__return_storage_ptr__,s2textformat *this,
          vector<S2LatLng,_std::allocator<S2LatLng>_> *latlngs)

{
  long lVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar2 = 0;
  for (uVar3 = 0; lVar1 = *(long *)this, uVar3 < (ulong)(*(long *)(this + 8) - lVar1 >> 4);
      uVar3 = uVar3 + 1) {
    if (lVar2 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      lVar1 = *(long *)this;
    }
    AppendVertex((S2LatLng *)(lVar1 + lVar2),__return_storage_ptr__);
    lVar2 = lVar2 + 0x10;
  }
  return __return_storage_ptr__;
}

Assistant:

string ToString(const vector<S2LatLng>& latlngs) {
  string out;
  for (int i = 0; i < latlngs.size(); ++i) {
    if (i > 0) out += ", ";
    AppendVertex(latlngs[i], &out);
  }
  return out;
}